

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O1

bool __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_key(basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
            *this,string_view_type *name,ser_context *param_2,error_code *param_3)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  uchar local_2b [3];
  
  this_00 = &this->buffer_;
  (this->stack_).
  super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1].name_offset_ =
       (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_2b[2] = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,local_2b + 2);
  sVar1 = name->_M_len;
  if (sVar1 != 0) {
    pcVar2 = name->_M_str;
    sVar3 = 0;
    do {
      local_2b[0] = pcVar2[sVar3];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (this_00,local_2b);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  local_2b[1] = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,local_2b + 1);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context&, std::error_code&) override
    {
        stack_.back().member_offset(buffer_.size());
        buffer_.push_back(0x00); // reserve space for code
        for (auto c : name)
        {
            buffer_.push_back(c);
        }
        buffer_.push_back(0x00);
        JSONCONS_VISITOR_RETURN;
    }